

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::analysis::RuntimeArray::str_abi_cxx11_
          (string *__return_storage_ptr__,RuntimeArray *this)

{
  ostream *poVar1;
  string local_1b0 [32];
  ostringstream local_190 [8];
  ostringstream oss;
  RuntimeArray *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"[");
  (*this->element_type_->_vptr_Type[3])(local_1b0);
  poVar1 = std::operator<<(poVar1,local_1b0);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string RuntimeArray::str() const {
  std::ostringstream oss;
  oss << "[" << element_type_->str() << "]";
  return oss.str();
}